

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void UpdateModel(CPpmd7 *p)

{
  uint *puVar1;
  Byte BVar2;
  byte bVar3;
  undefined2 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined4 uVar9;
  uint uVar10;
  CPpmd_State *pCVar11;
  Byte *pBVar12;
  CPpmd7_Context *pCVar13;
  int iVar14;
  byte bVar15;
  ulong uVar16;
  CTX_PTR pCVar17;
  undefined4 *puVar18;
  void *pvVar19;
  uint uVar20;
  Byte *pBVar21;
  Byte *pBVar22;
  CPpmd_Void_Ref *pCVar23;
  short sVar24;
  long lVar25;
  short sVar26;
  uint uVar27;
  uint uVar28;
  CPpmd7_Context *pCVar29;
  UInt32 n;
  ulong uVar30;
  CPpmd_State tmp;
  uint local_5c;
  
  pCVar11 = p->FoundState;
  local_5c._0_2_ = pCVar11->SuccessorLow;
  local_5c._2_2_ = pCVar11->SuccessorHigh;
  if ((pCVar11->Freq < 0x1f) && (uVar16 = (ulong)p->MinContext->Suffix, uVar16 != 0)) {
    pBVar12 = p->Base;
    if (*(short *)(pBVar12 + uVar16) == 1) {
      if (pBVar12[uVar16 + 3] < 0x20) {
        pBVar12[uVar16 + 3] = pBVar12[uVar16 + 3] + 1;
      }
    }
    else {
      pBVar22 = pBVar12 + *(uint *)(pBVar12 + uVar16 + 4);
      if (pBVar12[*(uint *)(pBVar12 + uVar16 + 4)] != pCVar11->Symbol) {
        do {
          pBVar21 = pBVar22;
          pBVar22 = pBVar21 + 6;
        } while (pBVar21[6] != pCVar11->Symbol);
        if (pBVar21[1] <= pBVar21[7]) {
          uVar4 = *(undefined2 *)(pBVar21 + 10);
          uVar9 = *(undefined4 *)pBVar22;
          *(undefined2 *)(pBVar21 + 10) = *(undefined2 *)(pBVar21 + 4);
          *(undefined4 *)pBVar22 = *(undefined4 *)pBVar21;
          *(undefined2 *)(pBVar21 + 4) = uVar4;
          *(undefined4 *)pBVar21 = uVar9;
          pBVar22 = pBVar21;
        }
      }
      if (pBVar22[1] < 0x73) {
        pBVar22[1] = pBVar22[1] + 2;
        *(short *)(pBVar12 + uVar16 + 2) = *(short *)(pBVar12 + uVar16 + 2) + 2;
      }
    }
  }
  if (p->OrderFall == 0) {
    pCVar17 = CreateSuccessors(p,1);
    p->MaxContext = pCVar17;
    p->MinContext = pCVar17;
    if (pCVar17 == (CTX_PTR)0x0) goto LAB_00186687;
    *(int *)&p->FoundState->SuccessorLow = (int)pCVar17 - *(int *)&p->Base;
  }
  else {
    pBVar12 = p->Text;
    BVar2 = p->FoundState->Symbol;
    p->Text = pBVar12 + 1;
    *pBVar12 = BVar2;
    if (p->UnitsStart <= p->Text) {
LAB_00186687:
      RestartModel(p);
      return;
    }
    iVar14 = (int)p->Base;
    uVar28 = (int)p->Text - iVar14;
    if (local_5c == 0) {
      *(uint *)&p->FoundState->SuccessorLow = uVar28;
      local_5c = *(int *)&p->MinContext - iVar14;
    }
    else {
      if (local_5c <= uVar28) {
        pCVar17 = CreateSuccessors(p,0);
        if (pCVar17 == (CTX_PTR)0x0) {
          RestartModel(p);
          return;
        }
        local_5c = (int)pCVar17 - *(int *)&p->Base;
      }
      puVar1 = &p->OrderFall;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        p->Text = p->Text + -(ulong)(p->MaxContext != p->MinContext);
        uVar28 = local_5c;
      }
    }
    pCVar13 = p->MinContext;
    pCVar29 = p->MaxContext;
    if (pCVar29 != pCVar13) {
      uVar5 = pCVar13->NumStats;
      bVar3 = p->FoundState->Freq;
      uVar6 = pCVar13->SummFreq;
      uVar20 = (uint)uVar5;
      do {
        uVar7 = pCVar29->NumStats;
        uVar16 = (ulong)uVar7;
        if (uVar7 == 1) {
          puVar18 = (undefined4 *)AllocUnits(p,0);
          if (puVar18 == (undefined4 *)0x0) {
            RestartModel(p);
          }
          else {
            *(undefined2 *)(puVar18 + 1) = *(undefined2 *)((long)&pCVar29->Stats + 2);
            *puVar18 = *(undefined4 *)&pCVar29->SummFreq;
            pCVar29->Stats = (int)puVar18 - *(int *)&p->Base;
            bVar15 = *(byte *)((long)puVar18 + 1) * '\x02';
            if (0x1d < *(byte *)((long)puVar18 + 1)) {
              bVar15 = 0x78;
            }
            *(byte *)((long)puVar18 + 1) = bVar15;
            pCVar29->SummFreq = (short)p->InitEsc + (ushort)(3 < uVar5) + (ushort)bVar15;
          }
          if (puVar18 == (undefined4 *)0x0) {
            return;
          }
        }
        else {
          if ((uVar7 & 1) == 0) {
            uVar30 = (ulong)(uint)(uVar7 >> 1);
            bVar15 = p->Units2Indx[(uVar7 >> 1) - 1];
            if (bVar15 != p->Units2Indx[uVar30]) {
              pvVar19 = AllocUnits(p,bVar15 + 1);
              if (pvVar19 == (void *)0x0) {
                RestartModel(p);
              }
              else {
                pBVar12 = p->Base;
                uVar10 = pCVar29->Stats;
                pCVar23 = (CPpmd_Void_Ref *)(pBVar12 + uVar10);
                lVar25 = 0;
                do {
                  *(undefined4 *)((long)pvVar19 + lVar25) = *(undefined4 *)((long)pCVar23 + lVar25);
                  *(undefined4 *)((long)pvVar19 + lVar25 + 4) =
                       *(undefined4 *)((long)pCVar23 + lVar25 + 4);
                  *(undefined4 *)((long)pvVar19 + lVar25 + 8) =
                       *(undefined4 *)((long)pCVar23 + lVar25 + 8);
                  lVar25 = lVar25 + 0xc;
                  uVar27 = (int)uVar30 - 1;
                  uVar30 = (ulong)uVar27;
                } while (uVar27 != 0);
                *pCVar23 = p->FreeList[bVar15];
                p->FreeList[bVar15] = uVar10;
                pCVar29->Stats = (int)pvVar19 - (int)pBVar12;
              }
              if (pvVar19 == (void *)0x0) {
                return;
              }
            }
          }
          pCVar29->SummFreq =
               pCVar29->SummFreq + (ushort)((uint)uVar7 * 2 < uVar20) +
               (ushort)((uint)pCVar29->SummFreq <= (uint)uVar7 * 8 && (uint)uVar7 * 4 <= uVar20) * 2
          ;
        }
        pCVar11 = p->FoundState;
        uVar8 = pCVar29->SummFreq;
        uVar10 = (uVar8 + 6) * (uint)pCVar11->Freq * 2;
        uVar27 = ((uint)uVar6 - (bVar3 + uVar20)) + 1 + (uint)uVar8;
        if (uVar10 < uVar27 * 6) {
          sVar26 = 3;
          sVar24 = ((ushort)(uVar27 < uVar10) - (ushort)(uVar10 < uVar27 * 4)) + 2;
        }
        else {
          sVar26 = ((-(ushort)(uVar10 < uVar27 * 0xc) - (ushort)(uVar10 < uVar27 * 9)) + 7) -
                   (ushort)(uVar10 < uVar27 * 0xf);
          sVar24 = sVar26;
        }
        pCVar29->SummFreq = sVar26 + uVar8;
        pBVar12 = p->Base;
        uVar10 = pCVar29->Stats;
        *(short *)(pBVar12 + uVar16 * 6 + (ulong)uVar10 + 2) = (short)uVar28;
        *(short *)(pBVar12 + uVar16 * 6 + (ulong)uVar10 + 4) = (short)(uVar28 >> 0x10);
        pBVar12[uVar16 * 6 + (ulong)uVar10] = pCVar11->Symbol;
        pBVar12[uVar16 * 6 + (ulong)uVar10 + 1] = (Byte)sVar24;
        pCVar29->NumStats = uVar7 + 1;
        pCVar29 = (CPpmd7_Context *)(pBVar12 + pCVar29->Suffix);
      } while (pCVar29 != p->MinContext);
    }
    p->MinContext = (CPpmd7_Context *)(p->Base + local_5c);
    p->MaxContext = (CPpmd7_Context *)(p->Base + local_5c);
  }
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}